

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitArrayNewData
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          ArrayNewData *curr)

{
  ulong uVar1;
  bool bVar2;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  unsigned_long a;
  size_t reservedSize;
  size_type sVar4;
  size_type sVar5;
  Name NVar6;
  Literal local_1b0 [2];
  Literal local_180;
  const_reference local_168;
  void *addr;
  ulong uStack_158;
  Index i;
  uint64_t end;
  char *pcStack_148;
  uint elemBytes;
  undefined8 uStack_140;
  long local_130;
  DataSegment *seg;
  Literals contents;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  Field *element;
  HeapType heapType;
  uint64_t size;
  uint64_t offset;
  Flow sizeFlow;
  undefined1 local_68 [8];
  Flow offsetFlow;
  ArrayNewData *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  offsetFlow.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar3,
             *(Expression **)(offsetFlow.breakTo.super_IString.str._M_str + 0x20));
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    sizeFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
    goto LAB_001c4122;
  }
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&offset,pEVar3,
             *(Expression **)(offsetFlow.breakTo.super_IString.str._M_str + 0x28));
  bVar2 = Flow::breaking((Flow *)&offset);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)&offset);
    sizeFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
  }
  else {
    Flow::getSingleValue((Flow *)local_68);
    a = ::wasm::Literal::getUnsigned();
    Flow::getSingleValue((Flow *)&offset);
    reservedSize = ::wasm::Literal::getUnsigned();
    Type::getHeapType((Type *)(offsetFlow.breakTo.super_IString.str._M_str + 8));
    ::wasm::HeapType::getArray();
    Literals::Literals((Literals *)&seg);
    pcStack_148 = *(char **)(offsetFlow.breakTo.super_IString.str._M_str + 0x10);
    uStack_140 = *(undefined8 *)(offsetFlow.breakTo.super_IString.str._M_str + 0x18);
    NVar6.super_IString.str._M_str = pcStack_148;
    NVar6.super_IString.str._M_len = (size_t)this->wasm;
    local_130 = ::wasm::Module::getDataSegment(NVar6);
    end._4_4_ = ::wasm::Field::getByteSize();
    bVar2 = std::ckd_add<unsigned_long>(&stack0xfffffffffffffea8,a,reservedSize * end._4_4_);
    uVar1 = uStack_158;
    if (bVar2) {
LAB_001c3f0a:
      (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                (this,"out of bounds segment access in array.new_data");
    }
    else {
      sVar4 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)(local_130 + 0x38));
      if (sVar4 < uVar1) goto LAB_001c3f0a;
    }
    sVar5 = std::
            unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
            ::count(&this->droppedDataSegments,
                    (key_type *)(offsetFlow.breakTo.super_IString.str._M_str + 0x10));
    if ((sVar5 != 0) && (uStack_158 != 0)) {
      (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                (this,"dropped segment access in array.new_data");
    }
    SmallVector<wasm::Literal,_1UL>::reserve((SmallVector<wasm::Literal,_1UL> *)&seg,reservedSize);
    for (addr._4_4_ = (uint)a; addr._4_4_ < uStack_158; addr._4_4_ = end._4_4_ + addr._4_4_) {
      local_168 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)(local_130 + 0x38),
                             (ulong)addr._4_4_);
      ExpressionRunner<wasm::ModuleRunner>::makeFromMemory
                (&local_180,&this->super_ExpressionRunner<wasm::ModuleRunner>,local_168,
                 CONCAT44(contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_,
                          contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._0_4_),
                 CONCAT44(uStack_e4,uStack_e8));
      SmallVector<wasm::Literal,_1UL>::push_back((SmallVector<wasm::Literal,_1UL> *)&seg,&local_180)
      ;
      ::wasm::Literal::~Literal(&local_180);
    }
    pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::makeGCData
              (local_1b0,pEVar3,(Literals *)&seg,
               (Type)*(uintptr_t *)(offsetFlow.breakTo.super_IString.str._M_str + 8));
    Flow::Flow(__return_storage_ptr__,local_1b0);
    ::wasm::Literal::~Literal(local_1b0);
    sizeFlow.breakTo.super_IString.str._M_str._0_4_ = 1;
    Literals::~Literals((Literals *)&seg);
  }
  Flow::~Flow((Flow *)&offset);
LAB_001c4122:
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNewData(ArrayNewData* curr) {
    NOTE_ENTER("ArrayNewData");
    auto offsetFlow = self()->visit(curr->offset);
    if (offsetFlow.breaking()) {
      return offsetFlow;
    }
    auto sizeFlow = self()->visit(curr->size);
    if (sizeFlow.breaking()) {
      return sizeFlow;
    }

    uint64_t offset = offsetFlow.getSingleValue().getUnsigned();
    uint64_t size = sizeFlow.getSingleValue().getUnsigned();

    auto heapType = curr->type.getHeapType();
    const auto& element = heapType.getArray().element;
    Literals contents;

    const auto& seg = *wasm.getDataSegment(curr->segment);
    auto elemBytes = element.getByteSize();

#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wmaybe-uninitialized"

    uint64_t end;
    if (std::ckd_add(&end, offset, size * elemBytes) || end > seg.data.size()) {
      trap("out of bounds segment access in array.new_data");
    }
    if (droppedDataSegments.count(curr->segment) && end > 0) {
      trap("dropped segment access in array.new_data");
    }
    contents.reserve(size);
    for (Index i = offset; i < end; i += elemBytes) {
      auto addr = (void*)&seg.data[i];
      contents.push_back(this->makeFromMemory(addr, element));
    }

#pragma GCC diagnostic pop

    return self()->makeGCData(std::move(contents), curr->type);
  }